

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_GLSL_destarg_assign(Context *ctx,char *buf,size_t buflen,char *fmt,...)

{
  char cVar1;
  ulong uVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2c8 [32];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char *local_218;
  char *rightparen;
  char *leftparen;
  ulong uStack_200;
  int scalar;
  size_t i;
  char *pcStack_1f0;
  char writemask_str [6];
  char *regtype_str;
  char regnum_str [16];
  char *result_shift_str;
  undefined4 local_1c8;
  int len;
  va_list ap;
  char local_1a8 [8];
  char operation [256];
  char *pcStack_98;
  int vecsize;
  char *clampright;
  char *clampleft;
  char clampbuf [32];
  DestArgInfo *arg;
  int need_parens;
  char *fmt_local;
  size_t buflen_local;
  char *buf_local;
  Context *ctx_local;
  
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  if ((ctx->dest_arg).writemask == 0) {
    *buf = '\0';
  }
  else {
    local_2a8 = in_R8;
    local_2a0 = in_R9;
    memset(&clampleft,0,0x20);
    clampright = "";
    pcStack_98 = "";
    if (((ctx->dest_arg).result_mod & 1U) != 0) {
      uVar3 = vecsize_from_writemask((ctx->dest_arg).writemask);
      clampright = "clamp(";
      if (uVar3 == 1) {
        pcStack_98 = ", 0.0, 1.0)";
      }
      else {
        snprintf((char *)&clampleft,0x20,", vec%d(0.0), vec%d(1.0))",(ulong)uVar3,(ulong)uVar3);
        pcStack_98 = (char *)&clampleft;
      }
    }
    if (((ctx->dest_arg).result_mod & 4U) != 0) {
      __assert_fail("(arg->result_mod & MOD_CENTROID) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x75c,
                    "const char *make_GLSL_destarg_assign(Context *, char *, const size_t, const char *, ...)"
                   );
    }
    if (ctx->predicated == 0) {
      ap[0].overflow_arg_area = local_2c8;
      ap[0]._0_8_ = &stack0x00000008;
      len = 0x30;
      local_1c8 = 0x20;
      uVar3 = vsnprintf(local_1a8,0x100,fmt,&local_1c8);
      if (uVar3 < 0x100) {
        regnum_str._8_8_ = (long)"MOJOSHADER_glCreateContext() fail: %s\n" + 0x26;
        switch((ctx->dest_arg).result_shift) {
        case 1:
          regnum_str._8_8_ = anon_var_dwarf_755e;
          break;
        case 2:
          regnum_str._8_8_ = anon_var_dwarf_756a;
          break;
        case 3:
          regnum_str._8_8_ = anon_var_dwarf_7576;
          break;
        case 0xd:
          regnum_str._8_8_ = anon_var_dwarf_7582;
          break;
        case 0xe:
          regnum_str._8_8_ = anon_var_dwarf_758e;
          break;
        case 0xf:
          regnum_str._8_8_ = anon_var_dwarf_759a;
        }
        cVar1 = *(char *)regnum_str._8_8_;
        pcStack_1f0 = get_GLSL_register_string
                                (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,
                                 (char *)&regtype_str,0x10);
        uStack_200 = 0;
        leftparen._4_4_ =
             isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
        if ((leftparen._4_4_ == 0) &&
           (iVar4 = writemask_xyzw((ctx->dest_arg).writemask), iVar4 == 0)) {
          *(undefined1 *)((long)&i + uStack_200 + 2) = 0x2e;
          uVar2 = uStack_200 + 1;
          if ((ctx->dest_arg).writemask0 != 0) {
            *(undefined1 *)((long)&i + uStack_200 + 3) = 0x78;
            uVar2 = uStack_200 + 2;
          }
          uStack_200 = uVar2;
          if ((ctx->dest_arg).writemask1 != 0) {
            *(undefined1 *)((long)&i + uStack_200 + 2) = 0x79;
            uStack_200 = uStack_200 + 1;
          }
          if ((ctx->dest_arg).writemask2 != 0) {
            *(undefined1 *)((long)&i + uStack_200 + 2) = 0x7a;
            uStack_200 = uStack_200 + 1;
          }
          if ((ctx->dest_arg).writemask3 != 0) {
            *(undefined1 *)((long)&i + uStack_200 + 2) = 0x77;
            uStack_200 = uStack_200 + 1;
          }
        }
        *(undefined1 *)((long)&i + uStack_200 + 2) = 0;
        if (5 < uStack_200) {
          __assert_fail("i < sizeof (writemask_str)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x78d,
                        "const char *make_GLSL_destarg_assign(Context *, char *, const size_t, const char *, ...)"
                       );
        }
        rightparen = "";
        if (cVar1 != '\0') {
          rightparen = "(";
        }
        local_218 = "";
        if (cVar1 != '\0') {
          local_218 = ")";
        }
        snprintf(buf,buflen,"%s_%s%s%s = %s%s%s%s%s%s;",ctx->shader_type_str,pcStack_1f0,
                 &regtype_str,(long)&i + 2,clampright,rightparen,local_1a8,local_218,
                 regnum_str._8_8_,pcStack_98);
      }
      else {
        fail(ctx,"operation string too large");
        *buf = '\0';
      }
    }
    else {
      fail(ctx,"predicated destinations unsupported");
      *buf = '\0';
    }
  }
  return buf;
}

Assistant:

static const char *make_GLSL_destarg_assign(Context *ctx, char *buf,
                                            const size_t buflen,
                                            const char *fmt, ...)
{
    int need_parens = 0;
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->writemask == 0)
    {
        *buf = '\0';
        return buf;  // no writemask? It's a no-op.
    } // if

    char clampbuf[32] = { '\0' };
    const char *clampleft = "";
    const char *clampright = "";
    if (arg->result_mod & MOD_SATURATE)
    {
        const int vecsize = vecsize_from_writemask(arg->writemask);
        clampleft = "clamp(";
        if (vecsize == 1)
            clampright = ", 0.0, 1.0)";
        else
        {
            snprintf(clampbuf, sizeof (clampbuf),
                     ", vec%d(0.0), vec%d(1.0))", vecsize, vecsize);
            clampright = clampbuf;
        } // else
    } // if

    // MSDN says MOD_PP is a hint and many implementations ignore it. So do we.

    // CENTROID only allowed in DCL opcodes, which shouldn't come through here.
    assert((arg->result_mod & MOD_CENTROID) == 0);

    if (ctx->predicated)
    {
        fail(ctx, "predicated destinations unsupported");  // !!! FIXME
        *buf = '\0';
        return buf;
    } // if

    char operation[256];
    va_list ap;
    va_start(ap, fmt);
    const int len = vsnprintf(operation, sizeof (operation), fmt, ap);
    va_end(ap);
    if (len >= sizeof (operation))
    {
        fail(ctx, "operation string too large");  // I'm lazy.  :P
        *buf = '\0';
        return buf;
    } // if

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = " * 2.0"; break;
        case 0x2: result_shift_str = " * 4.0"; break;
        case 0x3: result_shift_str = " * 8.0"; break;
        case 0xD: result_shift_str = " / 8.0"; break;
        case 0xE: result_shift_str = " / 4.0"; break;
        case 0xF: result_shift_str = " / 2.0"; break;
    } // switch
    need_parens |= (result_shift_str[0] != '\0');

    char regnum_str[16];
    const char *regtype_str = get_GLSL_register_string(ctx, arg->regtype,
                                                       arg->regnum, regnum_str,
                                                       sizeof (regnum_str));
    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *leftparen = (need_parens) ? "(" : "";
    const char *rightparen = (need_parens) ? ")" : "";

    snprintf(buf, buflen, "%s_%s%s%s = %s%s%s%s%s%s;",
             ctx->shader_type_str, regtype_str, regnum_str, writemask_str,
             clampleft, leftparen, operation, rightparen, result_shift_str,
             clampright);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}